

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O1

source_t * deci::AssembleProgram(source_t *__return_storage_ptr__,istream *input)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  double val;
  char *pcVar4;
  long lVar5;
  int iVar6;
  mapped_type *pmVar7;
  undefined4 extraout_var;
  binop_t<deci::sum_xclass_t> *pbVar8;
  undefined4 extraout_var_00;
  iterator iVar9;
  value_t *pvVar10;
  runtime_error *this;
  opcode_t oVar11;
  pointer pcVar12;
  string labelToken;
  string opcodeToken;
  string argToken;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labels;
  allocator local_111;
  source_t *local_110;
  undefined1 local_108 [48];
  char *local_d8;
  long local_d0;
  char local_c8 [16];
  command_t local_b8;
  char *local_a8;
  undefined8 local_a0;
  char local_98 [16];
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_110 = __return_storage_ptr__;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) break;
    local_d0 = 0;
    local_c8[0] = '\0';
    local_d8 = local_c8;
    std::operator>>(input,(string *)&local_d8);
    lVar5 = local_d0;
    pcVar4 = local_d8;
    if (local_d0 != 0) {
      iVar6 = strcasecmp(local_d8,"nop");
      if (iVar6 == 0) {
        oVar11 = OP_FIRST;
      }
      else {
        iVar6 = strcasecmp(pcVar4,"arg");
        if (iVar6 == 0) {
          oVar11 = OP_ARG;
        }
        else {
          iVar6 = strcasecmp(pcVar4,"push");
          if (iVar6 == 0) {
            oVar11 = OP_PUSH;
          }
          else {
            iVar6 = strcasecmp(pcVar4,"resl");
            if (iVar6 == 0) {
              oVar11 = OP_RESULT;
            }
            else {
              iVar6 = strcasecmp(pcVar4,"drop");
              if (iVar6 == 0) {
                oVar11 = OP_DROP;
              }
              else {
                iVar6 = strcasecmp(pcVar4,"call");
                if (iVar6 == 0) {
                  oVar11 = OP_CALL;
                }
                else {
                  iVar6 = strcasecmp(pcVar4,"ret");
                  if (iVar6 == 0) {
                    oVar11 = OP_RETURN;
                  }
                  else {
                    iVar6 = strcasecmp(pcVar4,"bin");
                    if (iVar6 == 0) {
                      oVar11 = OP_BIN;
                    }
                    else {
                      iVar6 = strcasecmp(pcVar4,"rval");
                      if (iVar6 == 0) {
                        oVar11 = OP_RVAL;
                      }
                      else {
                        iVar6 = strcasecmp(pcVar4,"set");
                        if (iVar6 == 0) {
                          oVar11 = OP_SET;
                        }
                        else {
                          iVar6 = strcasecmp(pcVar4,"unr");
                          if (iVar6 == 0) {
                            oVar11 = OP_UNR;
                          }
                          else {
                            iVar6 = strcasecmp(pcVar4,"jz");
                            if (iVar6 == 0) {
                              oVar11 = OP_JZ;
                            }
                            else {
                              iVar6 = strcasecmp(pcVar4,"jmp");
                              if (iVar6 == 0) {
                                oVar11 = OP_JMP;
                              }
                              else {
                                iVar6 = strcasecmp(pcVar4,":");
                                if (iVar6 == 0) {
                                  oVar11 = OP_LABEL;
                                }
                                else {
                                  iVar6 = strcasecmp(pcVar4,"jnz");
                                  oVar11 = -(uint)(iVar6 != 0) | OP_JNZ;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (oVar11 < OP_RETURN) {
        if (oVar11 == OP_RESULT) goto LAB_0010867e;
        if (oVar11 == OP_UNDEFINED) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"Unknown opcode");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_001086d0:
        local_a0 = 0;
        local_98[0] = '\0';
        local_a8 = local_98;
        std::operator>>(input,(string *)&local_a8);
        pcVar4 = local_a8;
        local_b8.opcode = oVar11;
        if ((byte)(*local_a8 - 0x30U) < 10) {
          val = atof(local_a8);
          number_t::number_t((number_t *)local_108,val);
          pvVar10 = number_t::Copy((number_t *)local_108);
          number_t::~number_t((number_t *)local_108);
        }
        else {
          iVar6 = strcasecmp(local_a8,"sum");
          if (iVar6 == 0) {
            pbVar8 = binop_t<deci::sum_xclass_t>::Instance();
          }
          else {
            iVar6 = strcasecmp(pcVar4,"sub");
            if (iVar6 == 0) {
              pbVar8 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::sub_xclass_t>::Instance();
            }
            else {
              iVar6 = strcasecmp(pcVar4,"mul");
              if (iVar6 == 0) {
                pbVar8 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::mul_xclass_t>::Instance();
              }
              else {
                iVar6 = strcasecmp(pcVar4,"div");
                if (iVar6 == 0) {
                  pbVar8 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::div_xclass_t>::Instance();
                }
                else {
                  iVar6 = strcasecmp(pcVar4,"ls");
                  if (iVar6 == 0) {
                    pbVar8 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::ls_xclass_t>::Instance();
                  }
                  else {
                    iVar6 = strcasecmp(pcVar4,"gr");
                    if (iVar6 == 0) {
                      pbVar8 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::gr_xclass_t>::Instance()
                      ;
                    }
                    else {
                      iVar6 = strcasecmp(pcVar4,"le");
                      if (iVar6 == 0) {
                        pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                 binop_t<deci::le_xclass_t>::Instance();
                      }
                      else {
                        iVar6 = strcasecmp(pcVar4,"ge");
                        if (iVar6 == 0) {
                          pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                   binop_t<deci::ge_xclass_t>::Instance();
                        }
                        else {
                          iVar6 = strcasecmp(pcVar4,"eq");
                          if (iVar6 == 0) {
                            pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                     binop_t<deci::eq_xclass_t>::Instance();
                          }
                          else {
                            iVar6 = strcasecmp(pcVar4,"neq");
                            if (iVar6 == 0) {
                              pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                       binop_t<deci::neq_xclass_t>::Instance();
                            }
                            else {
                              iVar6 = strcasecmp(pcVar4,"or");
                              if (iVar6 == 0) {
                                pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                         binop_t<deci::or_xclass_t>::Instance();
                              }
                              else {
                                iVar6 = strcasecmp(pcVar4,"and");
                                if (iVar6 == 0) {
                                  pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                           binop_t<deci::and_xclass_t>::Instance();
                                }
                                else {
                                  iVar6 = strcasecmp(pcVar4,"xor");
                                  if (iVar6 == 0) {
                                    pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                             binop_t<deci::xor_xclass_t>::Instance();
                                  }
                                  else {
                                    iVar6 = strcasecmp(pcVar4,"pow");
                                    if (iVar6 == 0) {
                                      pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                               binop_t<deci::pow_xclass_t>::Instance();
                                    }
                                    else {
                                      iVar6 = strcasecmp(pcVar4,"mod");
                                      if (iVar6 == 0) {
                                        pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                                 binop_t<deci::mod_xclass_t>::Instance();
                                      }
                                      else {
                                        iVar6 = strcasecmp(pcVar4,"not");
                                        if (iVar6 == 0) {
                                          pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                                   unrop_t<deci::not_xclass_t>::Instance();
                                        }
                                        else {
                                          iVar6 = strcasecmp(pcVar4,"neg");
                                          if (iVar6 == 0) {
                                            pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                                     unrop_t<deci::neg_xclass_t>::Instance();
                                          }
                                          else {
                                            iVar6 = strcasecmp(pcVar4,"print");
                                            if (iVar6 != 0) {
                                              std::__cxx11::string::string
                                                        ((string *)&local_88,pcVar4,&local_111);
                                              string_t::string_t((string_t *)local_108,&local_88);
                                              pvVar10 = string_t::Copy((string_t *)local_108);
                                              string_t::~string_t((string_t *)local_108);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_88._M_dataplus._M_p != &local_88.field_2)
                                              {
                                                operator_delete(local_88._M_dataplus._M_p);
                                              }
                                              goto LAB_001089ba;
                                            }
                                            pbVar8 = (binop_t<deci::sum_xclass_t> *)
                                                     print_t::Instance();
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar6 = (*(pbVar8->super_function_t).super_value_t._vptr_value_t[2])(pbVar8);
          pvVar10 = (value_t *)CONCAT44(extraout_var_00,iVar6);
        }
LAB_001089ba:
        iVar3._M_current =
             (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        local_b8.arg = pvVar10;
        if (iVar3._M_current ==
            (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<deci::command_t,_std::allocator<deci::command_t>_>::
          _M_realloc_insert<deci::command_t>(local_110,iVar3,&local_b8);
        }
        else {
          *(ulong *)iVar3._M_current = CONCAT44(local_b8._4_4_,local_b8.opcode);
          (iVar3._M_current)->arg = pvVar10;
          ppcVar1 = &(local_110->
                     super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
      }
      else if (oVar11 == OP_RETURN) {
LAB_0010867e:
        local_108._0_4_ = oVar11;
        pvVar10 = nothing_t::Instance();
        iVar6 = (*pvVar10->_vptr_value_t[2])(pvVar10);
        local_108._8_8_ = CONCAT44(extraout_var,iVar6);
        iVar3._M_current =
             (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<deci::command_t,_std::allocator<deci::command_t>_>::
          _M_realloc_insert<deci::command_t>(local_110,iVar3,(command_t *)local_108);
        }
        else {
          *(undefined8 *)iVar3._M_current = local_108._0_8_;
          (iVar3._M_current)->arg = (value_t *)local_108._8_8_;
          ppcVar1 = &(local_110->
                     super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      else {
        if (oVar11 != OP_LABEL) goto LAB_001086d0;
        local_108._0_8_ = local_108 + 0x10;
        local_108._8_8_ = (value_t *)0x0;
        local_108[0x10] = '\0';
        std::operator>>(input,(string *)local_108);
        pcVar12 = (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,(key_type *)local_108);
        *pmVar7 = (mapped_type)((ulong)((long)pcVar2 - (long)pcVar12) >> 4);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_);
        }
      }
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
  } while (lVar5 != 0);
  pcVar12 = (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (local_110->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar12 != pcVar2) {
    do {
      iVar6 = (*pcVar12->arg->_vptr_value_t[1])();
      if ((iVar6 == 1) &&
         (iVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_68,(key_type *)(pcVar12->arg + 1)),
         iVar9.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
         ._M_cur != (__node_type *)0x0)) {
        (*pcVar12->arg->_vptr_value_t[3])();
        number_t::number_t((number_t *)local_108,
                           (double)*(int *)((long)iVar9.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                  ._M_cur + 0x28));
        pvVar10 = number_t::Copy((number_t *)local_108);
        pcVar12->arg = pvVar10;
        number_t::~number_t((number_t *)local_108);
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 != pcVar2);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return local_110;
}

Assistant:

program_t::source_t AssembleProgram(std::istream& input) {
    program_t::source_t result;
    std::unordered_map<std::string, int> labels;

    while(!input.eof()) {
      std::string opcodeToken;

      input >> opcodeToken;

      if (opcodeToken.size() == 0) {
        break;
      }

      opcode_t opcode = SelectOpcode(opcodeToken.c_str());
      switch (opcode) {
      case OP_UNDEFINED:
        throw std::runtime_error("Unknown opcode");
      case OP_RESULT:
      case OP_RETURN:
        result.push_back({ opcode, nothing_t::Instance().Copy() });
        break;
      case OP_LABEL:
        {
          std::string labelToken;
          input >> labelToken;
          labels[labelToken] = result.size();
          break;
        }
      default:
        {
          std::string argToken;
          input >> argToken;
          result.push_back({ opcode, SelectValue(argToken.c_str()) });
          break;
        }
      }
    }

    // Fix label pointers
    for (auto& item: result) {
      if (item.arg->Type() == value_t::STRING) {
        string_t& str = static_cast<string_t&>(*item.arg);
        auto it = labels.find(str.Value());
        if (it != labels.end()) {
          item.arg->Delete();
          item.arg = number_t(it->second).Copy();
        }
      }
    }

    return result;
  }